

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<float>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,float *v)

{
  bool bVar1;
  value_type_conflict *pvVar2;
  optional<float> local_5c;
  optional<float> local_54;
  optional<float> pv_1;
  optional<float> local_40;
  optional<float> pv;
  float *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (float *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_005fe596;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv);
  if (bVar1) {
    get_default_value<float>((optional<float> *)&pv_1.contained,this);
    nonstd::optional_lite::optional<float>::optional<float,_0>
              (&local_40,(optional<float> *)&pv_1.contained);
    nonstd::optional_lite::optional<float>::~optional((optional<float> *)&pv_1.contained);
    pv_1.has_value_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
    if (pv_1.has_value_) {
      pvVar2 = nonstd::optional_lite::optional<float>::value(&local_40);
      *v = *pvVar2;
      this_local._7_1_ = 1;
    }
    pv_1._1_3_ = 0;
    nonstd::optional_lite::optional<float>::~optional(&local_40);
    if (pv_1._0_4_ != 0) goto LAB_005fe596;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_005fe596;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ = tinyusdz::value::TimeSamples::get<float,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<float>(&local_5c,this);
      nonstd::optional_lite::optional<float>::optional<float,_0>(&local_54,&local_5c);
      nonstd::optional_lite::optional<float>::~optional(&local_5c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_54);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<float>::value(&local_54);
        *v = *pvVar2;
        this_local._7_1_ = 1;
      }
      pv_1._1_3_ = 0;
      pv_1.has_value_ = bVar1;
      nonstd::optional_lite::optional<float>::~optional(&local_54);
      if (pv_1._0_4_ != 0) goto LAB_005fe596;
    }
    this_local._7_1_ = 0;
  }
LAB_005fe596:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }